

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

void llvm::
     SmallVectorTemplateBase<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<454U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<455U,_Fixpp::Type::String>,_Fixpp::TagT<456U,_Fixpp::Type::String>_>_>,_false>
     ::destroy_range(InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<454U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<455U,_Fixpp::Type::String>,_Fixpp::TagT<456U,_Fixpp::Type::String>_>_>
                     *S,InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<454U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<455U,_Fixpp::Type::String>,_Fixpp::TagT<456U,_Fixpp::Type::String>_>_>
                        *E)

{
  InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<454U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<455U,_Fixpp::Type::String>,_Fixpp::TagT<456U,_Fixpp::Type::String>_>_>
  *local_18;
  InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<454U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<455U,_Fixpp::Type::String>,_Fixpp::TagT<456U,_Fixpp::Type::String>_>_>
  *E_local;
  InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<454U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<455U,_Fixpp::Type::String>,_Fixpp::TagT<456U,_Fixpp::Type::String>_>_>
  *S_local;
  
  local_18 = E;
  while (S != local_18) {
    local_18 = local_18 + -1;
    Fixpp::
    InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<454U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<455U,_Fixpp::Type::String>,_Fixpp::TagT<456U,_Fixpp::Type::String>_>_>
    ::~InstanceGroup(local_18);
  }
  return;
}

Assistant:

static void destroy_range(T *S, T *E) {
    while (S != E) {
      --E;
      E->~T();
    }
  }